

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_iso9660.c
# Opt level: O0

void parse_rockridge_TF1(file_info *file,uchar *data,int data_length)

{
  byte bVar1;
  int iVar2;
  time_t tVar3;
  int local_1c;
  char flag;
  uchar *puStack_18;
  int data_length_local;
  uchar *data_local;
  file_info *file_local;
  
  if (0 < data_length) {
    bVar1 = *data;
    puStack_18 = data + 1;
    local_1c = data_length + -1;
    if (((int)(char)bVar1 & 0x80U) == 0) {
      if (((bVar1 & 1) != 0) && (6 < local_1c)) {
        iVar2 = isodate7_valid(puStack_18);
        if (iVar2 != 0) {
          file->time_is_set = file->time_is_set | 1;
          tVar3 = isodate7(puStack_18);
          file->birthtime = tVar3;
        }
        puStack_18 = data + 8;
        local_1c = data_length + -8;
      }
      if (((bVar1 & 2) != 0) && (6 < local_1c)) {
        iVar2 = isodate7_valid(puStack_18);
        if (iVar2 != 0) {
          file->time_is_set = file->time_is_set | 2;
          tVar3 = isodate7(puStack_18);
          file->mtime = tVar3;
        }
        puStack_18 = puStack_18 + 7;
        local_1c = local_1c + -7;
      }
      if (((bVar1 & 4) != 0) && (6 < local_1c)) {
        iVar2 = isodate7_valid(puStack_18);
        if (iVar2 != 0) {
          file->time_is_set = file->time_is_set | 4;
          tVar3 = isodate7(puStack_18);
          file->atime = tVar3;
        }
        puStack_18 = puStack_18 + 7;
        local_1c = local_1c + -7;
      }
      if ((((bVar1 & 8) != 0) && (6 < local_1c)) && (iVar2 = isodate7_valid(puStack_18), iVar2 != 0)
         ) {
        file->time_is_set = file->time_is_set | 8;
        tVar3 = isodate7(puStack_18);
        file->ctime = tVar3;
      }
    }
    else {
      if (((bVar1 & 1) != 0) && (0x10 < local_1c)) {
        iVar2 = isodate17_valid(puStack_18);
        if (iVar2 != 0) {
          file->time_is_set = file->time_is_set | 1;
          tVar3 = isodate17(puStack_18);
          file->birthtime = tVar3;
        }
        puStack_18 = data + 0x12;
        local_1c = data_length + -0x12;
      }
      if (((bVar1 & 2) != 0) && (0x10 < local_1c)) {
        iVar2 = isodate17_valid(puStack_18);
        if (iVar2 != 0) {
          file->time_is_set = file->time_is_set | 2;
          tVar3 = isodate17(puStack_18);
          file->mtime = tVar3;
        }
        puStack_18 = puStack_18 + 0x11;
        local_1c = local_1c + -0x11;
      }
      if (((bVar1 & 4) != 0) && (0x10 < local_1c)) {
        iVar2 = isodate17_valid(puStack_18);
        if (iVar2 != 0) {
          file->time_is_set = file->time_is_set | 4;
          tVar3 = isodate17(puStack_18);
          file->atime = tVar3;
        }
        puStack_18 = puStack_18 + 0x11;
        local_1c = local_1c + -0x11;
      }
      if ((((bVar1 & 8) != 0) && (0x10 < local_1c)) &&
         (iVar2 = isodate17_valid(puStack_18), iVar2 != 0)) {
        file->time_is_set = file->time_is_set | 8;
        tVar3 = isodate17(puStack_18);
        file->ctime = tVar3;
      }
    }
  }
  return;
}

Assistant:

static void
parse_rockridge_TF1(struct file_info *file, const unsigned char *data,
    int data_length)
{
	char flag;
	/*
	 * TF extension comprises:
	 *   one byte flag
	 *   create time (optional)
	 *   modify time (optional)
	 *   access time (optional)
	 *   attribute time (optional)
	 *  Time format and presence of fields
	 *  is controlled by flag bits.
	 */
	if (data_length < 1)
		return;
	flag = data[0];
	++data;
	--data_length;
	if (flag & 0x80) {
		/* Use 17-byte time format. */
		if ((flag & 1) && data_length >= 17) {
			/* Create time. */
			if (isodate17_valid(data)) {
				file->time_is_set |= BIRTHTIME_IS_SET;
				file->birthtime = isodate17(data);
			}
			data += 17;
			data_length -= 17;
		}
		if ((flag & 2) && data_length >= 17) {
			/* Modify time. */
			if (isodate17_valid(data)) {
				file->time_is_set |= MTIME_IS_SET;
				file->mtime = isodate17(data);
			}
			data += 17;
			data_length -= 17;
		}
		if ((flag & 4) && data_length >= 17) {
			/* Access time. */
			if (isodate17_valid(data)) {
				file->time_is_set |= ATIME_IS_SET;
				file->atime = isodate17(data);
			}
			data += 17;
			data_length -= 17;
		}
		if ((flag & 8) && data_length >= 17) {
			/* Attribute change time. */
			if (isodate17_valid(data)) {
				file->time_is_set |= CTIME_IS_SET;
				file->ctime = isodate17(data);
			}
		}
	} else {
		/* Use 7-byte time format. */
		if ((flag & 1) && data_length >= 7) {
			/* Create time. */
			if (isodate7_valid(data)) {
				file->time_is_set |= BIRTHTIME_IS_SET;
				file->birthtime = isodate7(data);
			}
			data += 7;
			data_length -= 7;
		}
		if ((flag & 2) && data_length >= 7) {
			/* Modify time. */
			if (isodate7_valid(data)) {
				file->time_is_set |= MTIME_IS_SET;
				file->mtime = isodate7(data);
			}
			data += 7;
			data_length -= 7;
		}
		if ((flag & 4) && data_length >= 7) {
			/* Access time. */
			if (isodate7_valid(data)) {
				file->time_is_set |= ATIME_IS_SET;
				file->atime = isodate7(data);
			}
			data += 7;
			data_length -= 7;
		}
		if ((flag & 8) && data_length >= 7) {
			/* Attribute change time. */
			if (isodate7_valid(data)) {
				file->time_is_set |= CTIME_IS_SET;
				file->ctime = isodate7(data);
			}
		}
	}
}